

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

int32 rw::ps2::getSizeADC(void *object,int32 offset,int32 param_3)

{
  if (*(int *)((long)object + (long)offset) == 0) {
    return 0;
  }
  if ((*(byte *)((long)object + 0x13) & 1) == 0) {
    return (*(int *)((long)object + (long)offset + 0x10) + 3U & 0xfffffffc) + 0x10;
  }
  return 0x10;
}

Assistant:

static int32
getSizeADC(void *object, int32 offset, int32)
{
	Geometry *geometry = (Geometry*)object;
	ADCData *adc = PLUGINOFFSET(ADCData, object, offset);
	if(!adc->adcFormatted)
		return 0;
	if(geometry->flags & Geometry::NATIVE)
		return 16;
	return 16 + (adc->numBits+3 & ~3);
}